

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O3

void __thiscall Company::~Company(Company *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Employee **ppEVar2;
  Employee *pEVar3;
  pointer pcVar4;
  Boss *pBVar5;
  int iVar6;
  long lVar7;
  
  lVar7 = 0;
  while( true ) {
    iVar6 = Boss::getNumberOfEmployees(this->boss);
    ppEVar2 = this->employees;
    if (iVar6 <= lVar7) break;
    pEVar3 = ppEVar2[lVar7];
    if (pEVar3 != (Employee *)0x0) {
      (pEVar3->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00109d98;
      pcVar4 = (pEVar3->super_Person).address.street._M_dataplus._M_p;
      paVar1 = &(pEVar3->super_Person).address.street.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pEVar3->super_Person).address.city._M_dataplus._M_p;
      paVar1 = &(pEVar3->super_Person).address.city.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pEVar3->super_Person).address.country._M_dataplus._M_p;
      paVar1 = &(pEVar3->super_Person).address.country.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pEVar3->super_Person).id._M_dataplus._M_p;
      paVar1 = &(pEVar3->super_Person).id.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pcVar4 = (pEVar3->super_Person).name._M_dataplus._M_p;
      paVar1 = &(pEVar3->super_Person).name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
    }
    operator_delete(pEVar3,0xb8);
    lVar7 = lVar7 + 1;
  }
  if (ppEVar2 != (Employee **)0x0) {
    operator_delete__(ppEVar2);
  }
  pBVar5 = this->boss;
  if (pBVar5 != (Boss *)0x0) {
    (pBVar5->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_validate_00109d98;
    pcVar4 = (pBVar5->super_Employee).super_Person.address.street._M_dataplus._M_p;
    paVar1 = &(pBVar5->super_Employee).super_Person.address.street.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (pBVar5->super_Employee).super_Person.address.city._M_dataplus._M_p;
    paVar1 = &(pBVar5->super_Employee).super_Person.address.city.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (pBVar5->super_Employee).super_Person.address.country._M_dataplus._M_p;
    paVar1 = &(pBVar5->super_Employee).super_Person.address.country.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (pBVar5->super_Employee).super_Person.id._M_dataplus._M_p;
    paVar1 = &(pBVar5->super_Employee).super_Person.id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    pcVar4 = (pBVar5->super_Employee).super_Person.name._M_dataplus._M_p;
    paVar1 = &(pBVar5->super_Employee).super_Person.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pBVar5,0xc0);
  return;
}

Assistant:

Company::~Company() {
    // delete memory of all of the employees and boss
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        delete employees[i];
    }
    delete[] employees;
    delete boss;
}